

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeFloatingState.cpp
# Opt level: O0

void __thiscall iDynTree::FreeFloatingVel::resize(FreeFloatingVel *this,Model *model)

{
  JointDOFsDoubleArray *this_00;
  Model *in_RSI;
  long in_RDI;
  size_t in_stack_ffffffffffffffd8;
  SpatialVector<iDynTree::SpatialMotionVector> *in_stack_ffffffffffffffe0;
  
  SpatialVector<iDynTree::SpatialMotionVector>::zero(in_stack_ffffffffffffffe0);
  this_00 = (JointDOFsDoubleArray *)(in_RDI + 0x38);
  Model::getNrOfDOFs(in_RSI);
  JointDOFsDoubleArray::resize(this_00,in_stack_ffffffffffffffd8);
  iDynTree::VectorDynSize::zero();
  return;
}

Assistant:

void FreeFloatingVel::resize(const Model& model)
{
    this->m_baseVel.zero();
    this->m_jointVel.resize(model.getNrOfDOFs());
    this->m_jointVel.zero();
}